

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O3

void __thiscall
libtorrent::peer_error_alert::peer_error_alert
          (peer_error_alert *this,stack_allocator *alloc,torrent_handle *h,endpoint *ep,
          peer_id *peer_id,operation_t op_,error_code *e)

{
  error_category *peVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  uint32_t uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  bool bVar9;
  undefined3 uVar10;
  undefined3 in_register_00000089;
  string local_48;
  
  torrent_alert::torrent_alert((torrent_alert *)this,alloc,h);
  (this->super_peer_alert).super_torrent_alert.super_alert._vptr_alert =
       (_func_int **)&PTR__torrent_alert_004557a0;
  uVar6 = *(undefined8 *)&(ep->impl_).data_;
  uVar7 = *(undefined8 *)((long)&(ep->impl_).data_ + 8);
  uVar8 = *(undefined8 *)((long)&(ep->impl_).data_ + 0x14);
  *(undefined8 *)
   ((long)&(this->super_peer_alert).endpoint.super_basic_endpoint<boost::asio::ip::tcp>.impl_.data_
   + 0xc) = *(undefined8 *)((long)&(ep->impl_).data_ + 0xc);
  *(undefined8 *)
   ((long)&(this->super_peer_alert).endpoint.super_basic_endpoint<boost::asio::ip::tcp>.impl_.data_
   + 0x14) = uVar8;
  *(undefined8 *)
   &(this->super_peer_alert).endpoint.super_basic_endpoint<boost::asio::ip::tcp>.impl_.data_ = uVar6
  ;
  *(undefined8 *)
   ((long)&(this->super_peer_alert).endpoint.super_basic_endpoint<boost::asio::ip::tcp>.impl_.data_
   + 8) = uVar7;
  uVar6 = *(undefined8 *)((peer_id->m_number)._M_elems + 2);
  *(undefined8 *)(this->super_peer_alert).pid.m_number._M_elems =
       *(undefined8 *)(peer_id->m_number)._M_elems;
  *(undefined8 *)((this->super_peer_alert).pid.m_number._M_elems + 2) = uVar6;
  (this->super_peer_alert).pid.m_number._M_elems[4] = (peer_id->m_number)._M_elems[4];
  uVar6 = *(undefined8 *)((long)&(ep->impl_).data_ + 8);
  uVar2 = *(undefined4 *)((long)&(ep->impl_).data_ + 0xc);
  uVar3 = *(undefined4 *)((long)&(ep->impl_).data_ + 0x10);
  uVar4 = *(undefined4 *)((long)&(ep->impl_).data_ + 0x14);
  uVar5 = (ep->impl_).data_.v6.sin6_scope_id;
  *(undefined8 *)&(this->super_peer_alert).ip.super_basic_endpoint<boost::asio::ip::tcp>.impl_.data_
       = *(undefined8 *)&(ep->impl_).data_;
  *(undefined8 *)
   ((long)&(this->super_peer_alert).ip.super_basic_endpoint<boost::asio::ip::tcp>.impl_.data_ + 8) =
       uVar6;
  *(undefined4 *)
   ((long)&(this->super_peer_alert).ip.super_basic_endpoint<boost::asio::ip::tcp>.impl_.data_ + 0xc)
       = uVar2;
  *(undefined4 *)
   ((long)&(this->super_peer_alert).ip.super_basic_endpoint<boost::asio::ip::tcp>.impl_.data_ + 0x10
   ) = uVar3;
  *(undefined4 *)
   ((long)&(this->super_peer_alert).ip.super_basic_endpoint<boost::asio::ip::tcp>.impl_.data_ + 0x14
   ) = uVar4;
  (this->super_peer_alert).ip.super_basic_endpoint<boost::asio::ip::tcp>.impl_.data_.v6.
  sin6_scope_id = uVar5;
  (this->super_peer_alert).super_torrent_alert.super_alert._vptr_alert =
       (_func_int **)&PTR__peer_error_alert_00456b18;
  (this->super_peer_alert).field_0x9c = op_;
  bVar9 = e->failed_;
  uVar10 = *(undefined3 *)&e->field_0x5;
  uVar2 = *(undefined4 *)&e->cat_;
  uVar3 = *(undefined4 *)((long)&e->cat_ + 4);
  (this->error).val_ = e->val_;
  (this->error).failed_ = bVar9;
  *(undefined3 *)&(this->error).field_0x5 = uVar10;
  *(undefined4 *)&(this->error).cat_ = uVar2;
  *(undefined4 *)((long)&(this->error).cat_ + 4) = uVar3;
  this->operation = CONCAT31(in_register_00000089,op_);
  peVar1 = (this->error).cat_;
  (*peVar1->_vptr_error_category[4])(&local_48,peVar1,(ulong)(uint)(this->error).val_);
  convert_from_native(&this->msg,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

peer_error_alert::peer_error_alert(aux::stack_allocator& alloc, torrent_handle const& h
		, tcp::endpoint const& ep, peer_id const& peer_id, operation_t const op_
		, error_code const& e)
		: peer_alert(alloc, h, ep, peer_id)
		, op(op_)
		, error(e)
#if TORRENT_ABI_VERSION == 1
		, operation(static_cast<int>(op_))
		, msg(convert_from_native(error.message()))
#endif
	{}